

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateBuildDescriptors
          (FileGenerator *this,Printer *printer)

{
  FileDescriptorProto *this_00;
  FileDescriptor *pFVar1;
  int iVar2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_01;
  EnumGenerator *this_02;
  scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator> *this_03;
  ServiceGenerator *this_04;
  string *psVar6;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar7;
  MessageGenerator *pMVar8;
  size_type sVar9;
  reference value;
  ulong uVar10;
  ulong uVar11;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_05;
  ExtensionGenerator *this_06;
  undefined1 auVar12 [16];
  string local_340;
  string local_320;
  string local_300;
  int local_2dc;
  int local_2d8;
  int i_9;
  int i_8;
  int i_7;
  string local_2b0;
  string local_290;
  string local_270;
  int local_24c;
  undefined1 local_248 [4];
  int i_6;
  string file_data;
  FileDescriptorProto file_proto;
  int local_134;
  undefined1 local_130 [4];
  int j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependency_package_parts;
  FileDescriptor *dependency;
  int i_5;
  string local_e8;
  int local_c4;
  undefined1 local_c0 [4];
  int i_4;
  int local_9c;
  undefined1 local_98 [4];
  int i_3;
  int local_74;
  int local_70;
  int i_2;
  int i_1;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar4 = HasDescriptorMethods(this->file_);
  pPVar3 = local_18;
  if (bVar4) {
    psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
    GlobalAssignDescriptorsName(&local_38,psVar6);
    io::Printer::Print(pPVar3,"\nvoid $assigndescriptorsname$() {\n","assigndescriptorsname",
                       &local_38);
    std::__cxx11::string::~string((string *)&local_38);
    io::Printer::Indent(local_18);
    pPVar3 = local_18;
    psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
    GlobalAddDescriptorsName((string *)&i_1,psVar6);
    io::Printer::Print(pPVar3,"$adddescriptorsname$();\n","adddescriptorsname",(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    pPVar3 = local_18;
    psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Print(pPVar3,
                       "const ::google::protobuf::FileDescriptor* file =\n  ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(\n    \"$filename$\");\nGOOGLE_CHECK(file != NULL);\n"
                       ,"filename",psVar6);
    for (i_2 = 0; iVar2 = i_2, iVar5 = FileDescriptor::message_type_count(this->file_),
        iVar2 < iVar5; i_2 = i_2 + 1) {
      psVar7 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,(long)i_2);
      pMVar8 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                         (psVar7);
      MessageGenerator::GenerateDescriptorInitializer(pMVar8,local_18,i_2);
    }
    for (local_70 = 0; iVar2 = local_70, iVar5 = FileDescriptor::enum_type_count(this->file_),
        iVar2 < iVar5; local_70 = local_70 + 1) {
      this_01 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
                ::operator[](&this->enum_generators_,(long)local_70);
      this_02 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                          (this_01);
      EnumGenerator::GenerateDescriptorInitializer(this_02,local_18,local_70);
    }
    bVar4 = HasGenericServices(this->file_);
    if (bVar4) {
      for (local_74 = 0; iVar2 = local_74, iVar5 = FileDescriptor::service_count(this->file_),
          iVar2 < iVar5; local_74 = local_74 + 1) {
        this_03 = internal::
                  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>_>
                  ::operator[](&this->service_generators_,(long)local_74);
        this_04 = internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>::
                  operator->(this_03);
        ServiceGenerator::GenerateDescriptorInitializer(this_04,local_18,local_74);
      }
    }
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n\n");
    pPVar3 = local_18;
    psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
    GlobalAssignDescriptorsName((string *)local_98,psVar6);
    io::Printer::Print(pPVar3,
                       "namespace {\n\nGOOGLE_PROTOBUF_DECLARE_ONCE(protobuf_AssignDescriptors_once_);\ninline void protobuf_AssignDescriptorsOnce() {\n  ::google::protobuf::GoogleOnceInit(&protobuf_AssignDescriptors_once_,\n                 &$assigndescriptorsname$);\n}\n\n"
                       ,"assigndescriptorsname",(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    io::Printer::Print(local_18,
                       "void protobuf_RegisterTypes(const ::std::string&) {\n  protobuf_AssignDescriptorsOnce();\n"
                      );
    io::Printer::Indent(local_18);
    for (local_9c = 0; iVar2 = local_9c, iVar5 = FileDescriptor::message_type_count(this->file_),
        iVar2 < iVar5; local_9c = local_9c + 1) {
      psVar7 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,(long)local_9c);
      pMVar8 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                         (psVar7);
      MessageGenerator::GenerateTypeRegistrations(pMVar8,local_18);
    }
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n\n}  // namespace\n");
  }
  pPVar3 = local_18;
  psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
  GlobalShutdownFileName((string *)local_c0,psVar6);
  io::Printer::Print(pPVar3,"\nvoid $shutdownfilename$() {\n","shutdownfilename",(string *)local_c0)
  ;
  std::__cxx11::string::~string((string *)local_c0);
  io::Printer::Indent(local_18);
  for (local_c4 = 0; iVar2 = local_c4, iVar5 = FileDescriptor::message_type_count(this->file_),
      iVar2 < iVar5; local_c4 = local_c4 + 1) {
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)local_c4);
    pMVar8 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar7);
    MessageGenerator::GenerateShutdownCode(pMVar8,local_18);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n\n");
  pPVar3 = local_18;
  pFVar1 = this->file_;
  psVar6 = FileDescriptor::name_abi_cxx11_(pFVar1);
  GlobalAddDescriptorsName(&local_e8,psVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_5,"",(allocator<char> *)((long)&dependency + 7));
  PrintHandlingOptionalStaticInitializers
            (pFVar1,pPVar3,
             "void $adddescriptorsname$() {\n  static bool already_here = false;\n  if (already_here) return;\n  already_here = true;\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n"
             ,"void $adddescriptorsname$_impl() {\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n",
             "adddescriptorsname",&local_e8,(char *)0x0,(string *)&i_5);
  std::__cxx11::string::~string((string *)&i_5);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dependency + 7));
  std::__cxx11::string::~string((string *)&local_e8);
  io::Printer::Indent(local_18);
  for (dependency._0_4_ = 0; iVar2 = (int)dependency,
      iVar5 = FileDescriptor::dependency_count(this->file_), iVar2 < iVar5;
      dependency._0_4_ = (int)dependency + 1) {
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)FileDescriptor::dependency(this->file_,(int)dependency);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_130);
    psVar6 = FileDescriptor::package_abi_cxx11_
                       ((FileDescriptor *)
                        dependency_package_parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SplitStringUsing(psVar6,".",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_130);
    io::Printer::Print(local_18,"::");
    for (local_134 = 0;
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_130), pPVar3 = local_18, (ulong)(long)local_134 < sVar9;
        local_134 = local_134 + 1) {
      value = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_130,(long)local_134);
      io::Printer::Print(pPVar3,"$name$::","name",value);
    }
    psVar6 = FileDescriptor::name_abi_cxx11_
                       ((FileDescriptor *)
                        dependency_package_parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    GlobalAddDescriptorsName((string *)&file_proto._cached_size_,psVar6);
    io::Printer::Print(pPVar3,"$name$();\n","name",(string *)&file_proto._cached_size_);
    std::__cxx11::string::~string((string *)&file_proto._cached_size_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_130);
  }
  bVar4 = HasDescriptorMethods(this->file_);
  if (bVar4) {
    this_00 = (FileDescriptorProto *)((long)&file_data.field_2 + 8);
    FileDescriptorProto::FileDescriptorProto(this_00);
    FileDescriptor::CopyTo(this->file_,this_00);
    std::__cxx11::string::string((string *)local_248);
    MessageLite::SerializeToString
              ((MessageLite *)((long)&file_data.field_2 + 8),(string *)local_248);
    io::Printer::Print(local_18,"::google::protobuf::DescriptorPool::InternalAddGeneratedFile(");
    for (local_24c = 0; uVar10 = (ulong)local_24c, uVar11 = std::__cxx11::string::size(),
        pPVar3 = local_18, uVar10 < uVar11; local_24c = local_24c + 0x28) {
      std::__cxx11::string::substr((ulong)&local_2b0,(ulong)local_248);
      CEscape(&local_290,&local_2b0);
      EscapeTrigraphs(&local_270,&local_290);
      io::Printer::Print(pPVar3,"\n  \"$data$\"","data",&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    auVar12 = std::__cxx11::string::size();
    SimpleItoa_abi_cxx11_((string *)&i_8,auVar12._0_8_,auVar12._8_8_);
    io::Printer::Print(pPVar3,", $size$);\n","size",(string *)&i_8);
    std::__cxx11::string::~string((string *)&i_8);
    pPVar3 = local_18;
    psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Print(pPVar3,
                       "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n  \"$filename$\", &protobuf_RegisterTypes);\n"
                       ,"filename",psVar6);
    std::__cxx11::string::~string((string *)local_248);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8))
    ;
  }
  for (i_9 = 0; iVar2 = i_9, iVar5 = FileDescriptor::message_type_count(this->file_), iVar2 < iVar5;
      i_9 = i_9 + 1) {
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_9);
    pMVar8 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar7);
    MessageGenerator::GenerateDefaultInstanceAllocator(pMVar8,local_18);
  }
  for (local_2d8 = 0; iVar2 = local_2d8, iVar5 = FileDescriptor::extension_count(this->file_),
      iVar2 < iVar5; local_2d8 = local_2d8 + 1) {
    this_05 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_2d8);
    this_06 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_05);
    ExtensionGenerator::GenerateRegistration(this_06,local_18);
  }
  for (local_2dc = 0; iVar2 = local_2dc, iVar5 = FileDescriptor::message_type_count(this->file_),
      pPVar3 = local_18, iVar2 < iVar5; local_2dc = local_2dc + 1) {
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)local_2dc);
    pMVar8 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar7);
    MessageGenerator::GenerateDefaultInstanceInitializer(pMVar8,local_18);
  }
  psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
  GlobalShutdownFileName(&local_300,psVar6);
  io::Printer::Print(pPVar3,"::google::protobuf::internal::OnShutdown(&$shutdownfilename$);\n",
                     "shutdownfilename",&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n\n");
  pPVar3 = local_18;
  pFVar1 = this->file_;
  psVar6 = FileDescriptor::name_abi_cxx11_(pFVar1);
  GlobalAddDescriptorsName(&local_320,psVar6);
  psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
  FilenameIdentifier(&local_340,psVar6);
  PrintHandlingOptionalStaticInitializers
            (pFVar1,pPVar3,
             "// Force AddDescriptors() to be called at static initialization time.\nstruct StaticDescriptorInitializer_$filename$ {\n  StaticDescriptorInitializer_$filename$() {\n    $adddescriptorsname$();\n  }\n} static_descriptor_initializer_$filename$_;\n"
             ,
             "GOOGLE_PROTOBUF_DECLARE_ONCE($adddescriptorsname$_once_);\nvoid $adddescriptorsname$() {\n  ::google::protobuf::::google::protobuf::GoogleOnceInit(&$adddescriptorsname$_once_,\n                 &$adddescriptorsname$_impl);\n}\n"
             ,"adddescriptorsname",&local_320,"filename",&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  return;
}

Assistant:

void FileGenerator::GenerateBuildDescriptors(io::Printer* printer) {
  // AddDescriptors() is a file-level procedure which adds the encoded
  // FileDescriptorProto for this .proto file to the global DescriptorPool for
  // generated files (DescriptorPool::generated_pool()). It either runs at
  // static initialization time (by default) or when default_instance() is
  // called for the first time (in LITE_RUNTIME mode with
  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER flag enabled). This procedure also
  // constructs default instances and registers extensions.
  //
  // Its sibling, AssignDescriptors(), actually pulls the compiled
  // FileDescriptor from the DescriptorPool and uses it to populate all of
  // the global variables which store pointers to the descriptor objects.
  // It also constructs the reflection objects.  It is called the first time
  // anyone calls descriptor() or GetReflection() on one of the types defined
  // in the file.

  // In optimize_for = LITE_RUNTIME mode, we don't generate AssignDescriptors()
  // and we only use AddDescriptors() to allocate default instances.
  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "\n"
      "void $assigndescriptorsname$() {\n",
      "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()));
    printer->Indent();

    // Make sure the file has found its way into the pool.  If a descriptor
    // is requested *during* static init then AddDescriptors() may not have
    // been called yet, so we call it manually.  Note that it's fine if
    // AddDescriptors() is called multiple times.
    printer->Print(
      "$adddescriptorsname$();\n",
      "adddescriptorsname", GlobalAddDescriptorsName(file_->name()));

    // Get the file's descriptor from the pool.
    printer->Print(
      "const ::google::protobuf::FileDescriptor* file =\n"
      "  ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(\n"
      "    \"$filename$\");\n"
      // Note that this GOOGLE_CHECK is necessary to prevent a warning about "file"
      // being unused when compiling an empty .proto file.
      "GOOGLE_CHECK(file != NULL);\n",
      "filename", file_->name());

    // Go through all the stuff defined in this file and generated code to
    // assign the global descriptor pointers based on the file descriptor.
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateDescriptorInitializer(printer, i);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      enum_generators_[i]->GenerateDescriptorInitializer(printer, i);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        service_generators_[i]->GenerateDescriptorInitializer(printer, i);
      }
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n");

    // ---------------------------------------------------------------

    // protobuf_AssignDescriptorsOnce():  The first time it is called, calls
    // AssignDescriptors().  All later times, waits for the first call to
    // complete and then returns.
    printer->Print(
      "namespace {\n"
      "\n"
      "GOOGLE_PROTOBUF_DECLARE_ONCE(protobuf_AssignDescriptors_once_);\n"
      "inline void protobuf_AssignDescriptorsOnce() {\n"
      "  ::google::protobuf::GoogleOnceInit(&protobuf_AssignDescriptors_once_,\n"
      "                 &$assigndescriptorsname$);\n"
      "}\n"
      "\n",
      "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()));

    // protobuf_RegisterTypes():  Calls
    // MessageFactory::InternalRegisterGeneratedType() for each message type.
    printer->Print(
      "void protobuf_RegisterTypes(const ::std::string&) {\n"
      "  protobuf_AssignDescriptorsOnce();\n");
    printer->Indent();

    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateTypeRegistrations(printer);
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n"
      "}  // namespace\n");
  }

  // -----------------------------------------------------------------

  // ShutdownFile():  Deletes descriptors, default instances, etc. on shutdown.
  printer->Print(
    "\n"
    "void $shutdownfilename$() {\n",
    "shutdownfilename", GlobalShutdownFileName(file_->name()));
  printer->Indent();

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateShutdownCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n\n");

  // -----------------------------------------------------------------

  // Now generate the AddDescriptors() function.
  PrintHandlingOptionalStaticInitializers(
    file_, printer,
    // With static initializers.
    // Note that we don't need any special synchronization in the following code
    // because it is called at static init time before any threads exist.
    "void $adddescriptorsname$() {\n"
    "  static bool already_here = false;\n"
    "  if (already_here) return;\n"
    "  already_here = true;\n"
    "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n"
    "\n",
    // Without.
    "void $adddescriptorsname$_impl() {\n"
    "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n"
    "\n",
    // Vars.
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()));

  printer->Indent();

  // Call the AddDescriptors() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    vector<string> dependency_package_parts;
    SplitStringUsing(dependency->package(), ".", &dependency_package_parts);
    printer->Print("::");
    for (int j = 0; j < dependency_package_parts.size(); j++) {
      printer->Print("$name$::",
                     "name", dependency_package_parts[j]);
    }
    // Call its AddDescriptors function.
    printer->Print(
      "$name$();\n",
      "name", GlobalAddDescriptorsName(dependency->name()));
  }

  if (HasDescriptorMethods(file_)) {
    // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
    // and embed it as a string literal, which is parsed and built into real
    // descriptors at initialization time.
    FileDescriptorProto file_proto;
    file_->CopyTo(&file_proto);
    string file_data;
    file_proto.SerializeToString(&file_data);

    printer->Print(
      "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(");

    // Only write 40 bytes per line.
    static const int kBytesPerLine = 40;
    for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
      printer->Print("\n  \"$data$\"",
                     "data",
                     EscapeTrigraphs(
                         CEscape(file_data.substr(i, kBytesPerLine))));
    }
    printer->Print(
        ", $size$);\n",
      "size", SimpleItoa(file_data.size()));

    // Call MessageFactory::InternalRegisterGeneratedFile().
    printer->Print(
      "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n"
      "  \"$filename$\", &protobuf_RegisterTypes);\n",
      "filename", file_->name());
  }

  // Allocate and initialize default instances.  This can't be done lazily
  // since default instances are returned by simple accessors and are used with
  // extensions.  Speaking of which, we also register extensions at this time.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateDefaultInstanceAllocator(printer);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }

  printer->Print(
    "::google::protobuf::internal::OnShutdown(&$shutdownfilename$);\n",
    "shutdownfilename", GlobalShutdownFileName(file_->name()));

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  PrintHandlingOptionalStaticInitializers(
    file_, printer,
    // With static initializers.
    "// Force AddDescriptors() to be called at static initialization time.\n"
    "struct StaticDescriptorInitializer_$filename$ {\n"
    "  StaticDescriptorInitializer_$filename$() {\n"
    "    $adddescriptorsname$();\n"
    "  }\n"
    "} static_descriptor_initializer_$filename$_;\n",
    // Without.
    "GOOGLE_PROTOBUF_DECLARE_ONCE($adddescriptorsname$_once_);\n"
    "void $adddescriptorsname$() {\n"
    "  ::google::protobuf::::google::protobuf::GoogleOnceInit(&$adddescriptorsname$_once_,\n"
    "                 &$adddescriptorsname$_impl);\n"
    "}\n",
    // Vars.
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()),
    "filename", FilenameIdentifier(file_->name()));
}